

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::resize(Plotter *this,int width,int height)

{
  undefined4 uVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  dVar2 = (this->view).xmax;
  auVar8._0_8_ = (double)width;
  auVar8._8_8_ = (double)height;
  dVar3 = (this->view).ymin;
  dVar5 = (this->view).xmin;
  dVar6 = (this->view).ymax;
  uVar1 = (this->view).swid;
  uVar4 = (this->view).shigh;
  auVar9._8_8_ = (double)(int)uVar4;
  auVar9._0_8_ = (double)(int)uVar1;
  auVar9 = divpd(auVar8,auVar9);
  dVar7 = (auVar9._0_8_ + -1.0) * (dVar2 - dVar5) * 0.5;
  dVar10 = (auVar9._8_8_ + -1.0) * (dVar6 - dVar3) * 0.5;
  (this->view).xmax = dVar2 + dVar7;
  (this->view).xmin = dVar5 - dVar7;
  (this->view).ymax = dVar6 + dVar10;
  (this->view).ymin = dVar3 - dVar10;
  (this->view).swid = width;
  (this->view).shigh = height;
  this->require_update = true;
  return;
}

Assistant:

void Plotter::resize(int width, int height) {
    double wf = (view.xmax - view.xmin) * (1.*width / view.swid - 1.) / 2;
    double hf = (view.ymax - view.ymin) * (1.*height / view.shigh - 1.) / 2;
    view.xmax += wf; view.xmin -= wf;
    view.ymax += hf; view.ymin -= hf;

    view.swid = width;
    view.shigh = height;
    require_update = true;
}